

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

bool __thiscall BaseIndex::Init(BaseIndex *this)

{
  uint256 *puVar1;
  pointer ppCVar2;
  base_blob<256U> *pbVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  undefined4 extraout_var;
  Chainstate *pCVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CBlockIndex *pCVar8;
  CBlockIndex *pCVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  byte unaff_BPL;
  long in_FS_OFFSET;
  CBlockLocator locator;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  CBlockLocator local_108;
  unique_lock<std::recursive_mutex> local_e8;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  undefined1 local_78 [32];
  int local_58;
  undefined4 uStack_54;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CThreadInterrupt::reset(&this->m_interrupt);
  local_78._0_8_ = &cs_main;
  local_78._8_4_ = local_78._8_4_ & 0xffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_78);
  iVar6 = (*((this->m_chain)._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36])();
  pCVar7 = ChainstateManager::GetChainstateForIndexing
                     (*(ChainstateManager **)(CONCAT44(extraout_var,iVar6) + 0x50));
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_78);
  this->m_chainstate = pCVar7;
  iVar6 = (*((this->m_chain)._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36])();
  ValidationSignals::RegisterValidationInterface
            (*(ValidationSignals **)(CONCAT44(extraout_var_00,iVar6) + 0xe0),
             &this->super_CValidationInterface);
  local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
  bVar4 = CDBWrapper::Read<unsigned_char,CBlockLocator>
                    ((CDBWrapper *)CONCAT44(extraout_var_01,iVar6),"B9BaseIndex",&local_108);
  if (!bVar4) {
    if (local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((!bVar4) &&
       (local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  local_e8._M_device = &cs_main.super_recursive_mutex;
  local_e8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_e8);
  pCVar7 = this->m_chainstate;
  if (local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    SetBestBlockIndex(this,(CBlockIndex *)0x0);
  }
  else {
    pCVar8 = ::node::BlockManager::LookupBlockIndex
                       (pCVar7->m_blockman,
                        local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    if (pCVar8 == (CBlockIndex *)0x0) {
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,
                 "%s: best block of the index not found. Please rebuild the index.","");
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,local_d8,local_d0 + (long)local_d8);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_d8,local_d0 + (long)local_d8);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)local_78,(tinyformat *)local_b8,(bilingual_str *)&this->m_name,
                 in_RCX);
      unaff_BPL = InitError((bilingual_str *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_54,local_58) != &local_48) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_54,local_58),local_48._M_allocated_capacity + 1);
      }
      if ((mutex_type *)local_78._0_8_ != (mutex_type *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
    }
    else {
      SetBestBlockIndex(this,pCVar8);
    }
    if (pCVar8 == (CBlockIndex *)0x0) goto LAB_008919b4;
  }
  pCVar8 = (this->m_best_block_index)._M_b._M_p;
  if (pCVar8 == (CBlockIndex *)0x0) {
    uVar5 = 0;
  }
  else {
    puVar1 = pCVar8->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_58 = pCVar8->nHeight;
    local_78._0_8_ = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    local_78._8_4_ = *(undefined4 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    pbVar3 = &puVar1->super_base_blob<256U>;
    local_78[0xc] = (pbVar3->m_data)._M_elems[0xc];
    local_78[0xd] = (pbVar3->m_data)._M_elems[0xd];
    local_78[0xe] = (pbVar3->m_data)._M_elems[0xe];
    local_78[0xf] = (pbVar3->m_data)._M_elems[0xf];
    local_78._16_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_78._24_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    uVar5 = 1;
  }
  uStack_54 = CONCAT31(uStack_54._1_3_,uVar5);
  iVar6 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xb])(this);
  unaff_BPL = (byte)iVar6;
  if (unaff_BPL != 0) {
    ppCVar2 = (pCVar7->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar2 ==
        (pCVar7->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar9 = (CBlockIndex *)0x0;
    }
    else {
      pCVar9 = ppCVar2[-1];
    }
    LOCK();
    (this->m_synced)._M_base._M_i = pCVar9 == pCVar8;
    UNLOCK();
    LOCK();
    (this->m_init)._M_base._M_i = true;
    UNLOCK();
  }
LAB_008919b4:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_e8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(unaff_BPL & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::Init()
{
    AssertLockNotHeld(cs_main);

    // May need reset if index is being restarted.
    m_interrupt.reset();

    // m_chainstate member gives indexing code access to node internals. It is
    // removed in followup https://github.com/bitcoin/bitcoin/pull/24230
    m_chainstate = WITH_LOCK(::cs_main,
        return &m_chain->context()->chainman->GetChainstateForIndexing());
    // Register to validation interface before setting the 'm_synced' flag, so that
    // callbacks are not missed once m_synced is true.
    m_chain->context()->validation_signals->RegisterValidationInterface(this);

    CBlockLocator locator;
    if (!GetDB().ReadBestBlock(locator)) {
        locator.SetNull();
    }

    LOCK(cs_main);
    CChain& index_chain = m_chainstate->m_chain;

    if (locator.IsNull()) {
        SetBestBlockIndex(nullptr);
    } else {
        // Setting the best block to the locator's top block. If it is not part of the
        // best chain, we will rewind to the fork point during index sync
        const CBlockIndex* locator_index{m_chainstate->m_blockman.LookupBlockIndex(locator.vHave.at(0))};
        if (!locator_index) {
            return InitError(strprintf(Untranslated("%s: best block of the index not found. Please rebuild the index."), GetName()));
        }
        SetBestBlockIndex(locator_index);
    }

    // Child init
    const CBlockIndex* start_block = m_best_block_index.load();
    if (!CustomInit(start_block ? std::make_optional(interfaces::BlockKey{start_block->GetBlockHash(), start_block->nHeight}) : std::nullopt)) {
        return false;
    }

    // Note: this will latch to true immediately if the user starts up with an empty
    // datadir and an index enabled. If this is the case, indexation will happen solely
    // via `BlockConnected` signals until, possibly, the next restart.
    m_synced = start_block == index_chain.Tip();
    m_init = true;
    return true;
}